

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint256.cpp
# Opt level: O1

void __thiscall base_blob<160U>::SetHexDeprecated(base_blob<160U> *this,string_view str)

{
  uchar *puVar1;
  long lVar2;
  char cVar3;
  uchar uVar4;
  void *pvVar5;
  size_type sVar6;
  char *pcVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  short *psVar11;
  ulong uVar12;
  long lVar13;
  long in_FS_OFFSET;
  bool bVar14;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  long local_38;
  
  pcVar7 = str._M_str;
  uVar12 = str._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_data)._M_elems[0] = '\0';
  (this->m_data)._M_elems[1] = '\0';
  (this->m_data)._M_elems[2] = '\0';
  (this->m_data)._M_elems[3] = '\0';
  (this->m_data)._M_elems[4] = '\0';
  (this->m_data)._M_elems[5] = '\0';
  (this->m_data)._M_elems[6] = '\0';
  (this->m_data)._M_elems[7] = '\0';
  (this->m_data)._M_elems[8] = '\0';
  (this->m_data)._M_elems[9] = '\0';
  (this->m_data)._M_elems[10] = '\0';
  (this->m_data)._M_elems[0xb] = '\0';
  (this->m_data)._M_elems[0xc] = '\0';
  (this->m_data)._M_elems[0xd] = '\0';
  (this->m_data)._M_elems[0xe] = '\0';
  (this->m_data)._M_elems[0xf] = '\0';
  (this->m_data)._M_elems[0x10] = '\0';
  (this->m_data)._M_elems[0x11] = '\0';
  (this->m_data)._M_elems[0x12] = '\0';
  (this->m_data)._M_elems[0x13] = '\0';
  uVar10 = 0xffffffffffffffff;
  local_48._M_len = uVar12;
  local_48._M_str = pcVar7;
  if (uVar12 != 0) {
    uVar8 = 0;
    do {
      pvVar5 = memchr(" \f\n\r\t\v",(int)pcVar7[uVar8],6);
      uVar10 = uVar8;
      if (pvVar5 == (void *)0x0) break;
      uVar8 = uVar8 + 1;
      uVar10 = 0xffffffffffffffff;
    } while (uVar12 != uVar8);
  }
  if (uVar10 == 0xffffffffffffffff) {
    uVar12 = 0;
    psVar11 = (short *)0x0;
  }
  else {
    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                      (&local_48," \f\n\r\t\v",0xffffffffffffffff,6);
    if (local_48._M_len < uVar10) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   uVar10);
      }
      goto LAB_0015c13e;
    }
    uVar12 = (sVar6 - uVar10) + 1;
    if (local_48._M_len - uVar10 < uVar12) {
      uVar12 = local_48._M_len - uVar10;
    }
    psVar11 = (short *)(local_48._M_str + uVar10);
  }
  if ((1 < uVar12) && (*psVar11 == 0x7830)) {
    uVar12 = uVar12 - 2;
    psVar11 = psVar11 + 1;
  }
  if (uVar12 == 0) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    lVar13 = 0;
    do {
      cVar3 = HexDigit(*(char *)((long)psVar11 + lVar13));
      lVar9 = (ulong)(cVar3 != -1) + lVar9;
      if (cVar3 == -1) break;
      bVar14 = uVar12 - 1 != lVar13;
      lVar13 = lVar13 + 1;
    } while (bVar14);
  }
  if (lVar9 != 0) {
    lVar13 = 0;
    do {
      uVar4 = HexDigit(*(char *)((long)psVar11 + lVar9 + -1));
      (this->m_data)._M_elems[lVar13] = uVar4;
      if (lVar9 == 1) {
        lVar9 = 0;
      }
      else {
        lVar2 = lVar9 + -2;
        lVar9 = lVar9 + -2;
        cVar3 = HexDigit(*(char *)((long)psVar11 + lVar2));
        puVar1 = (this->m_data)._M_elems + lVar13;
        *puVar1 = *puVar1 | cVar3 << 4;
        lVar13 = lVar13 + 1;
      }
    } while ((lVar9 != 0) && (lVar13 < 0x14));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0015c13e:
  __stack_chk_fail();
}

Assistant:

void base_blob<BITS>::SetHexDeprecated(const std::string_view str)
{
    std::fill(m_data.begin(), m_data.end(), 0);

    const auto trimmed = util::RemovePrefixView(util::TrimStringView(str), "0x");

    // Note: if we are passed a greater number of digits than would fit as bytes
    // in m_data, we will be discarding the leftmost ones.
    // str="12bc" in a WIDTH=1 m_data => m_data[] == "\0xbc", not "0x12".
    size_t digits = 0;
    for (const char c : trimmed) {
        if (::HexDigit(c) == -1) break;
        ++digits;
    }
    unsigned char* p1 = m_data.data();
    unsigned char* pend = p1 + WIDTH;
    while (digits > 0 && p1 < pend) {
        *p1 = ::HexDigit(trimmed[--digits]);
        if (digits > 0) {
            *p1 |= ((unsigned char)::HexDigit(trimmed[--digits]) << 4);
            p1++;
        }
    }
}